

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_latpath_t * ps_astar_next(ps_astar_t *nbest)

{
  float fVar1;
  int32 w1;
  ps_lattice_t *ppVar2;
  ps_latpath_s *ppVar3;
  ps_latnode_t *ppVar4;
  latlink_list_t *plVar5;
  ps_latlink_t *ppVar6;
  ngram_model_t *model;
  ps_latpath_t *newpath;
  ps_latnode_t *ppVar7;
  int iVar8;
  latlink_list_t **pplVar9;
  int32 local_34;
  
  ppVar2 = nbest->dag;
  while( true ) {
    ppVar3 = nbest->path_list;
    nbest->top = ppVar3;
    if (ppVar3 == (ps_latpath_s *)0x0) {
      return (ps_latpath_t *)0x0;
    }
    nbest->path_list = ppVar3->next;
    if (ppVar3 == nbest->path_tail) {
      nbest->path_tail = (ps_latpath_t *)0x0;
    }
    nbest->n_path = nbest->n_path + -1;
    ppVar7 = ppVar3->node;
    iVar8 = nbest->ef;
    if (iVar8 <= ppVar7->sf) break;
    ppVar4 = ppVar2->end;
    if ((ppVar7 == ppVar4) && (ppVar4->sf < iVar8)) {
      return ppVar3;
    }
    if (ppVar7->fef < iVar8) {
      pplVar9 = &ppVar7->exits;
      while (plVar5 = *pplVar9, plVar5 != (latlink_list_t *)0x0) {
        if (-0x20000000 < (plVar5->link->to->info).fanin) {
          newpath = (ps_latpath_t *)
                    __listelem_malloc__(nbest->latpath_alloc,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                        ,0x68a);
          ppVar6 = plVar5->link;
          ppVar7 = ppVar6->to;
          newpath->node = ppVar7;
          newpath->parent = ppVar3;
          iVar8 = ppVar6->ascr + ppVar3->score;
          newpath->score = iVar8;
          model = nbest->lmset;
          if (model != (ngram_model_t *)0x0) {
            fVar1 = (float)nbest->lwf;
            w1 = ppVar3->node->basewid;
            if (ppVar3->parent == (ps_latpath_s *)0x0) {
              iVar8 = ngram_bg_score(model,ppVar7->basewid,w1,&local_34);
            }
            else {
              iVar8 = ngram_tg_score(model,ppVar7->basewid,w1,ppVar3->parent->node->basewid,
                                     &local_34);
            }
            iVar8 = (int)((float)newpath->score + fVar1 * (float)(iVar8 >> 10));
            newpath->score = iVar8;
            ppVar7 = newpath->node;
          }
          nbest->n_hyp_tried = nbest->n_hyp_tried + 1;
          iVar8 = iVar8 + (ppVar7->info).fanin;
          if ((nbest->n_path < 500) ||
             ((nbest->path_tail->node->info).fanin + nbest->path_tail->score <= iVar8)) {
            path_insert(nbest,newpath,iVar8);
          }
          else {
            __listelem_free__(nbest->latpath_alloc,newpath,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                              ,0x6a7);
            nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
          }
        }
        pplVar9 = &plVar5->next;
      }
    }
  }
  return ppVar3;
}

Assistant:

ps_latpath_t *
ps_astar_next(ps_astar_t *nbest)
{
    ps_lattice_t *dag;

    dag = nbest->dag;

    /* Pop the top (best) partial hypothesis */
    while ((nbest->top = nbest->path_list) != NULL) {
        nbest->path_list = nbest->path_list->next;
        if (nbest->top == nbest->path_tail)
            nbest->path_tail = NULL;
        nbest->n_path--;

        /* Complete hypothesis? */
        if ((nbest->top->node->sf >= nbest->ef)
            || ((nbest->top->node == dag->end) &&
                (nbest->ef > dag->end->sf))) {
            /* FIXME: Verify that it is non-empty.  Also we may want
             * to verify that it is actually distinct from other
             * paths, since often this is not the case*/
            return nbest->top;
        }
        else {
            if (nbest->top->node->fef < nbest->ef)
                path_extend(nbest, nbest->top);
        }
    }

    /* Did not find any more paths to extend. */
    return NULL;
}